

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeBindingDivisorTest::Clean
          (AttributeBindingDivisorTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  AttributeBindingDivisorTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(0);
  if (this->m_po != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_po);
    this->m_po = 0;
  }
  if (this->m_vao != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  if (this->m_bo_array != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_bo_array);
    this->m_bo_array = 0;
  }
  if (this->m_bo_xfb != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_bo_xfb);
    this->m_bo_xfb = 0;
  }
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void AttributeBindingDivisorTest::Clean()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(0);

	if (m_po)
	{
		gl.deleteProgram(m_po);

		m_po = 0;
	}

	if (m_vao)
	{
		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}

	if (m_bo_array)
	{
		gl.deleteBuffers(1, &m_bo_array);

		m_bo_array = 0;
	}

	if (m_bo_xfb)
	{
		gl.deleteBuffers(1, &m_bo_xfb);

		m_bo_xfb = 0;
	}

	while (gl.getError())
		;
}